

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::TestGroupStats::TestGroupStats(TestGroupStats *this,GroupInfo *_groupInfo)

{
  pointer pcVar1;
  size_t sVar2;
  
  this->_vptr_TestGroupStats = (_func_int **)&PTR__TestGroupStats_001a6060;
  (this->groupInfo).name._M_dataplus._M_p = (pointer)&(this->groupInfo).name.field_2;
  pcVar1 = (_groupInfo->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->groupInfo,pcVar1,pcVar1 + (_groupInfo->name)._M_string_length);
  sVar2 = _groupInfo->groupsCounts;
  (this->groupInfo).groupIndex = _groupInfo->groupIndex;
  (this->groupInfo).groupsCounts = sVar2;
  (this->totals).error = 0;
  (this->totals).assertions.passed = 0;
  (this->totals).assertions.failed = 0;
  (this->totals).assertions.failedButOk = 0;
  (this->totals).testCases.passed = 0;
  (this->totals).testCases.failed = 0;
  (this->totals).testCases.failedButOk = 0;
  this->aborting = false;
  return;
}

Assistant:

TestGroupStats::TestGroupStats( GroupInfo const& _groupInfo )
    :   groupInfo( _groupInfo ),
        aborting( false )
    {}